

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_CCtx * ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  ZSTD_cpuid_t ZVar1;
  
  if (((ulong)workspace & 7) == 0 && 0x3d8 < workspaceSize) {
    memset(workspace,0,workspaceSize);
    *(size_t *)((long)workspace + 0x1b8) = workspaceSize;
    *(long *)((long)workspace + 0x118) = (long)workspace + 0x3d8;
    *(size_t *)((long)workspace + 0x120) = workspaceSize - 0x3d8;
    if (0x3bdf < workspaceSize - 0x3d8) {
      *(long *)((long)workspace + 0x278) = (long)workspace + 0x3d8;
      *(long *)((long)workspace + 0x280) = (long)workspace + 0x15c8;
      *(long *)((long)workspace + 0x358) = (long)workspace + 0x27b8;
      ZVar1 = ZSTD_cpuid();
      *(U32 *)((long)workspace + 8) = ZVar1.f1c >> 8 & 1;
      return (ZSTD_CCtx *)workspace;
    }
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void *workspace, size_t workspaceSize)
{
    ZSTD_CCtx* const cctx = (ZSTD_CCtx*) workspace;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    memset(workspace, 0, workspaceSize);   /* may be a bit generous, could memset be smaller ? */
    cctx->staticSize = workspaceSize;
    cctx->workSpace = (void*)(cctx+1);
    cctx->workSpaceSize = workspaceSize - sizeof(ZSTD_CCtx);

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (cctx->workSpaceSize < HUF_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t)) return NULL;
    assert(((size_t)cctx->workSpace & (sizeof(void*)-1)) == 0);   /* ensure correct alignment */
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)cctx->workSpace;
    cctx->blockState.nextCBlock = cctx->blockState.prevCBlock + 1;
    {
        void* const ptr = cctx->blockState.nextCBlock + 1;
        cctx->entropyWorkspace = (U32*)ptr;
    }
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}